

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O0

EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
* __thiscall
LinearSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::SolveImpl(LinearSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
            *this,Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *polynome)

{
  cpp_dec_float<100U,_int,_void> *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *b;
  cpp_dec_float<100U,_int,_void> *this_00;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void,_void>
  *e;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *b_00;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  *in_stack_fffffffffffffeb8;
  undefined1 *puVar1;
  allocator_type *__a;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  *in_stack_fffffffffffffed0;
  initializer_list<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  in_stack_fffffffffffffed8;
  undefined1 local_118 [80];
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_a0 [24];
  undefined1 local_88 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_30;
  undefined1 *local_10;
  undefined1 *local_8;
  
  this_00 = in_RDI;
  local_30 = Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             ::B((Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)0x113b28);
  local_38 = Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             ::C((Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)0x113b3d);
  e = (expression<boost::multiprecision::detail::negate,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void,_void>
       *)local_a0;
  boost::multiprecision::operator-
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)in_RDI);
  b_00 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
          *)(local_a0 + 8);
  boost::multiprecision::operator/(in_stack_fffffffffffffeb8,b_00);
  puVar1 = local_88;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  number<boost::multiprecision::detail::negate,boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void,void>
            (b_00,e,this_00);
  local_10 = puVar1;
  local_8 = local_118;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,in_RDI);
  local_c0 = 1;
  __a = (allocator_type *)&stack0xfffffffffffffee7;
  local_c8 = local_118;
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)0x113bf5);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector(in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,__a);
  std::
  variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
  ::
  variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,void,void,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,void>
            ((variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
              *)this_00,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
              *)in_RDI);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             *)b_00);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::~allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x113c41);
  return (EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
          *)this_00;
}

Assistant:

EquationSolution<ValueType> SolveImpl(const Polynome<ValueType> &polynome) const override {
        const ValueType &b = polynome.B();
        const ValueType &c = polynome.C();
        
        ValueType x = -c / b;
        
        return std::vector<ValueType>({x});
    }